

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O1

int * Gia_ManToResub(Gia_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  piVar3 = (int *)calloc((long)p->nObjs * 2,4);
  iVar2 = Gia_ManIsNormalized(p);
  if (iVar2 == 0) {
    __assert_fail("Gia_ManIsNormalized(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x1f5,"int *Gia_ManToResub(Gia_Man_t *)");
  }
  iVar2 = p->nObjs;
  if (1 < (long)iVar2) {
    pGVar4 = p->pObjs;
    lVar5 = 1;
    iVar6 = 2;
    do {
      pGVar4 = pGVar4 + 1;
      uVar1 = *(ulong *)pGVar4;
      uVar7 = (uint)uVar1;
      if ((~uVar7 & 0x9fffffff) != 0) {
        if ((int)((int)lVar5 - (uVar7 & 0x1fffffff)) < 0) {
LAB_007a3713:
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        iVar8 = iVar6 + (uint)((uVar7 >> 0x1d & 1) != 0) + (uVar7 & 0x1fffffff) * -2;
        piVar3[lVar5 * 2] = iVar8;
        if (-1 < (int)uVar7 || (uVar1 & 0x1fffffff) == 0x1fffffff) {
          if (((int)uVar7 < 0) || ((int)(uVar1 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                          ,0x1ff,"int *Gia_ManToResub(Gia_Man_t *)");
          }
          uVar7 = (uint)(uVar1 >> 0x20);
          iVar8 = (int)lVar5 - (uVar7 & 0x1fffffff);
          if (iVar8 < 0) goto LAB_007a3713;
          iVar8 = (uVar7 >> 0x1d & 1) + iVar8 * 2;
        }
        piVar3[lVar5 * 2 + 1] = iVar8;
      }
      lVar5 = lVar5 + 1;
      iVar6 = iVar6 + 2;
    } while (iVar2 != lVar5);
  }
  return piVar3;
}

Assistant:

int * Gia_ManToResub( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, * pObjs = ABC_CALLOC( int, 2*Gia_ManObjNum(p) );
    assert( Gia_ManIsNormalized(p) );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            continue;
        pObjs[2*i+0] = Gia_ObjFaninLit0(Gia_ManObj(p, i), i);
        if ( Gia_ObjIsCo(pObj) )
            pObjs[2*i+1] = pObjs[2*i+0];
        else if ( Gia_ObjIsAnd(pObj) )
            pObjs[2*i+1] = Gia_ObjFaninLit1(Gia_ManObj(p, i), i);
        else assert( 0 );
    }
    return pObjs;
}